

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmpEstimation.cpp
# Opt level: O3

timespec diff(timespec *start,timespec *end)

{
  timespec tVar1;
  timespec tVar2;
  
  tVar1.tv_nsec = end->tv_nsec - start->tv_nsec;
  if (-1 < tVar1.tv_nsec) {
    tVar1.tv_sec = end->tv_sec - start->tv_sec;
    return tVar1;
  }
  tVar2.tv_sec = end->tv_sec + ~start->tv_sec;
  tVar2.tv_nsec = (end->tv_nsec - start->tv_nsec) + 1000000000;
  return tVar2;
}

Assistant:

timespec diff(const timespec & start, const timespec & end)
{
  timespec temp;
  if((end.tv_nsec - start.tv_nsec) < 0)
  {
    temp.tv_sec = end.tv_sec - start.tv_sec - 1;
    temp.tv_nsec = 1000000000 + end.tv_nsec - start.tv_nsec;
  }
  else
  {
    temp.tv_sec = end.tv_sec - start.tv_sec;
    temp.tv_nsec = end.tv_nsec - start.tv_nsec;
  }
  return temp;
}